

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aggregate_executor.hpp
# Opt level: O0

void duckdb::AggregateExecutor::
     BinaryScatter<duckdb::udf_covar_state_t,double,double,duckdb::UDFCovarPopOperation>
               (AggregateInputData *aggr_input_data,Vector *a,Vector *b,Vector *states,idx_t count)

{
  ulong in_RCX;
  ulong in_RDX;
  ulong in_RSI;
  UnifiedVectorFormat *in_R8;
  UnifiedVectorFormat sdata;
  UnifiedVectorFormat bdata;
  UnifiedVectorFormat adata;
  UnifiedVectorFormat *local_120;
  SelectionVector *in_stack_fffffffffffffee8;
  idx_t in_stack_fffffffffffffef0;
  udf_covar_state_t **in_stack_fffffffffffffef8;
  double *in_stack_ffffffffffffff00;
  AggregateInputData *in_stack_ffffffffffffff08;
  double *in_stack_ffffffffffffff10;
  SelectionVector *in_stack_ffffffffffffff20;
  SelectionVector *in_stack_ffffffffffffff28;
  ValidityMask *in_stack_ffffffffffffff30;
  ValidityMask *in_stack_ffffffffffffff38;
  UnifiedVectorFormat local_80 [72];
  UnifiedVectorFormat *local_38;
  ulong local_30;
  ulong local_28;
  ulong local_20;
  
  local_38 = in_R8;
  local_30 = in_RCX;
  local_28 = in_RDX;
  local_20 = in_RSI;
  duckdb::UnifiedVectorFormat::UnifiedVectorFormat(local_80);
  duckdb::UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)&stack0xffffffffffffff38);
  duckdb::UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)&local_120);
  duckdb::Vector::ToUnifiedFormat(local_20,local_38);
  duckdb::Vector::ToUnifiedFormat(local_28,local_38);
  duckdb::Vector::ToUnifiedFormat(local_30,local_38);
  UnifiedVectorFormat::GetData<double>(local_80);
  UnifiedVectorFormat::GetData<double>((UnifiedVectorFormat *)&stack0xffffffffffffff38);
  BinaryScatterLoop<duckdb::udf_covar_state_t,double,double,duckdb::UDFCovarPopOperation>
            (in_stack_ffffffffffffff10,in_stack_ffffffffffffff08,in_stack_ffffffffffffff00,
             in_stack_fffffffffffffef8,in_stack_fffffffffffffef0,in_stack_fffffffffffffee8,
             in_stack_ffffffffffffff20,in_stack_ffffffffffffff28,in_stack_ffffffffffffff30,
             in_stack_ffffffffffffff38);
  UnifiedVectorFormat::~UnifiedVectorFormat(local_120);
  UnifiedVectorFormat::~UnifiedVectorFormat(local_120);
  UnifiedVectorFormat::~UnifiedVectorFormat(local_120);
  return;
}

Assistant:

static void BinaryScatter(AggregateInputData &aggr_input_data, Vector &a, Vector &b, Vector &states, idx_t count) {
		UnifiedVectorFormat adata, bdata, sdata;

		a.ToUnifiedFormat(count, adata);
		b.ToUnifiedFormat(count, bdata);
		states.ToUnifiedFormat(count, sdata);

		BinaryScatterLoop<STATE_TYPE, A_TYPE, B_TYPE, OP>(
		    UnifiedVectorFormat::GetData<A_TYPE>(adata), aggr_input_data, UnifiedVectorFormat::GetData<B_TYPE>(bdata),
		    (STATE_TYPE **)sdata.data, count, *adata.sel, *bdata.sel, *sdata.sel, adata.validity, bdata.validity);
	}